

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O0

void UnityPrintLen(char *string,_UU32 length)

{
  bool bVar1;
  char *local_20;
  char *pch;
  _UU32 length_local;
  char *string_local;
  
  local_20 = string;
  if (string != (char *)0x0) {
    while( true ) {
      bVar1 = false;
      if (*local_20 != '\0') {
        bVar1 = (uint)((int)local_20 - (int)string) < length;
      }
      if (!bVar1) break;
      if ((*local_20 < '\x7f') && ('\x1f' < *local_20)) {
        putchar((int)*local_20);
      }
      else if (*local_20 == '\r') {
        putchar(0x5c);
        putchar(0x72);
      }
      else if (*local_20 == '\n') {
        putchar(0x5c);
        putchar(0x6e);
      }
      else {
        putchar(0x5c);
        UnityPrintNumberHex((long)*local_20,'\x02');
      }
      local_20 = local_20 + 1;
    }
  }
  return;
}

Assistant:

void UnityPrintLen(const char* string, const _UU32 length)
{
    const char* pch = string;

    if (pch != NULL)
    {
        while (*pch && (_UU32)(pch - string) < length)
        {
            /* printable characters plus CR & LF are printed */
            if ((*pch <= 126) && (*pch >= 32))
            {
                UNITY_OUTPUT_CHAR(*pch);
            }
            /* write escaped carriage returns */
            else if (*pch == 13)
            {
                UNITY_OUTPUT_CHAR('\\');
                UNITY_OUTPUT_CHAR('r');
            }
            /* write escaped line feeds */
            else if (*pch == 10)
            {
                UNITY_OUTPUT_CHAR('\\');
                UNITY_OUTPUT_CHAR('n');
            }
            /* unprintable characters are shown as codes */
            else
            {
                UNITY_OUTPUT_CHAR('\\');
                UnityPrintNumberHex((_U_UINT)*pch, 2);
            }
            pch++;
        }
    }
}